

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_anti_exfil_host_commit
              (secp256k1_context *ctx,uchar *rand_commitment32,uchar *rand32)

{
  undefined1 local_90 [8];
  secp256k1_sha256 sha;
  uchar *rand32_local;
  uchar *rand_commitment32_local;
  secp256k1_context *ctx_local;
  
  sha.bytes = (uint64_t)rand32;
  if (rand_commitment32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"rand_commitment32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (rand32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"rand32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_s2c_ecdsa_data_sha256_tagged((secp256k1_sha256 *)local_90);
    secp256k1_sha256_write((secp256k1_sha256 *)local_90,(uchar *)sha.bytes,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_90,rand_commitment32);
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ecdsa_anti_exfil_host_commit(const secp256k1_context* ctx, unsigned char* rand_commitment32, const unsigned char* rand32) {
    secp256k1_sha256 sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(rand_commitment32 != NULL);
    ARG_CHECK(rand32 != NULL);

    secp256k1_s2c_ecdsa_data_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand32, 32);
    secp256k1_sha256_finalize(&sha, rand_commitment32);
    return 1;
}